

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuadaptor_p.cpp
# Opt level: O2

int __thiscall QDBusMenuAdaptor::qt_metacall(QDBusMenuAdaptor *this,Call _c,int _id,void **_a)

{
  Call _c_00;
  undefined4 in_register_00000014;
  QObject *_o;
  void **in_R8;
  
  _c_00 = QDBusAbstractAdaptor::qt_metacall
                    ((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if ((int)_c_00 < 0) {
    return _c_00;
  }
  if (BindableProperty < _c) {
    return _c_00;
  }
  if ((0x14eU >> (_c & 0x1f) & 1) != 0) {
    qt_static_metacall(this,(QObject *)(ulong)_c,_c_00,(int)_a,in_R8);
    return _c_00 - ResetProperty;
  }
  if (_c == InvokeMetaMethod) {
    if (CustomCall < _c_00) goto LAB_0058969b;
    _o = (QObject *)0x0;
  }
  else {
    if (_c != RegisterMethodArgumentMetaType) {
      return _c_00;
    }
    if (CustomCall < _c_00) goto LAB_0058969b;
    _o = (QObject *)0x7;
  }
  qt_static_metacall(this,_o,_c_00,(int)_a,in_R8);
LAB_0058969b:
  return _c_00 - ConstructInPlace;
}

Assistant:

int QDBusMenuAdaptor::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDBusAbstractAdaptor::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 10)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 10;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 10)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 10;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    return _id;
}